

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O0

JSONNode ** json_realloc<JSONNode*>(JSONNode **ptr,size_t count)

{
  bool condition;
  allocator local_41;
  json_string local_40;
  JSONNode **local_20;
  void *result;
  size_t count_local;
  JSONNode **ptr_local;
  
  result = (void *)count;
  count_local = (size_t)ptr;
  local_20 = (JSONNode **)realloc(ptr,count << 3);
  condition = local_20 != (JSONNode **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Out of memory",&local_41);
  JSONDebug::_JSON_ASSERT(condition,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return local_20;
}

Assistant:

static inline T * json_realloc(T * ptr, size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, check the results of realloc to be sure it was successful
		  void * result = std::realloc(ptr, count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  return (T *)result;
	   #else
		  return (T *)std::realloc(ptr, count * sizeof(T));
	   #endif
    }